

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

BatchedMatMulLayerParams * __thiscall
CoreML::Specification::BatchedMatMulLayerParams::New(BatchedMatMulLayerParams *this,Arena *arena)

{
  BatchedMatMulLayerParams *this_00;
  
  this_00 = (BatchedMatMulLayerParams *)operator_new(0x38);
  BatchedMatMulLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::BatchedMatMulLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

BatchedMatMulLayerParams* BatchedMatMulLayerParams::New(::google::protobuf::Arena* arena) const {
  BatchedMatMulLayerParams* n = new BatchedMatMulLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}